

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O1

void try_send(NetSocket *s)

{
  bufchain *ch;
  char *__dest;
  int iVar1;
  size_t sVar2;
  ssize_t sVar3;
  int *piVar4;
  ulong __n;
  size_t __n_00;
  ulong data;
  int iVar5;
  ptrlen pVar6;
  
  ch = &s->output_data;
  __dest = s->oobdata;
  do {
    if (s->sending_oob == 0) {
      sVar2 = bufchain_size(ch);
      if (sVar2 == 0) {
        if (s->outgoingeof == EOF_PENDING) {
          shutdown(s->s,1);
          s->outgoingeof = EOF_SENT;
        }
        uxsel_tell(s);
        return;
      }
    }
    sVar2 = s->sending_oob;
    pVar6.len = sVar2;
    pVar6.ptr = __dest;
    if (sVar2 == 0) {
      pVar6 = bufchain_prefix(ch);
    }
    __n = pVar6.len;
    sVar3 = send(s->s,pVar6.ptr,__n,(uint)(sVar2 != 0));
    iVar5 = (int)sVar3;
    data = (ulong)iVar5;
    noise_ultralight(NOISE_SOURCE_IOLEN,data);
    if (iVar5 < 1) {
      iVar1 = 0;
      if (iVar5 < 0) {
        piVar4 = __errno_location();
        iVar1 = *piVar4;
      }
      if (iVar1 == 0xb) {
        s->writable = false;
      }
      else {
        s->pending_error = iVar1;
        uxsel_tell(s);
        queue_toplevel_callback(socket_error_callback,s);
      }
    }
    else if (s->sending_oob == 0) {
      bufchain_consume(ch,data);
    }
    else {
      __n_00 = __n - data;
      if (__n < data || __n_00 == 0) {
        s->sending_oob = 0;
      }
      else {
        memmove(__dest,__dest + data,__n_00);
        s->sending_oob = __n_00;
      }
    }
  } while (0 < iVar5);
  return;
}

Assistant:

void try_send(NetSocket *s)
{
    while (s->sending_oob || bufchain_size(&s->output_data) > 0) {
        int nsent;
        int err;
        const void *data;
        size_t len;
        int urgentflag;

        if (s->sending_oob) {
            urgentflag = MSG_OOB;
            len = s->sending_oob;
            data = &s->oobdata;
        } else {
            urgentflag = 0;
            ptrlen bufdata = bufchain_prefix(&s->output_data);
            data = bufdata.ptr;
            len = bufdata.len;
        }
        nsent = send(s->s, data, len, urgentflag);
        noise_ultralight(NOISE_SOURCE_IOLEN, nsent);
        if (nsent <= 0) {
            err = (nsent < 0 ? errno : 0);
            if (err == EWOULDBLOCK) {
                /*
                 * Perfectly normal: we've sent all we can for the moment.
                 */
                s->writable = false;
                return;
            } else {
                /*
                 * We unfortunately can't just call plug_closing(),
                 * because it's quite likely that we're currently
                 * _in_ a call from the code we'd be calling back
                 * to, so we'd have to make half the SSH code
                 * reentrant. Instead we flag a pending error on
                 * the socket, to be dealt with (by calling
                 * plug_closing()) at some suitable future moment.
                 */
                s->pending_error = err;
                /*
                 * Immediately cease selecting on this socket, so that
                 * we don't tight-loop repeatedly trying to do
                 * whatever it was that went wrong.
                 */
                uxsel_tell(s);
                /*
                 * Arrange to be called back from the top level to
                 * deal with the error condition on this socket.
                 */
                queue_toplevel_callback(socket_error_callback, s);
                return;
            }
        } else {
            if (s->sending_oob) {
                if (nsent < len) {
                    memmove(s->oobdata, s->oobdata+nsent, len-nsent);
                    s->sending_oob = len - nsent;
                } else {
                    s->sending_oob = 0;
                }
            } else {
                bufchain_consume(&s->output_data, nsent);
            }
        }
    }

    /*
     * If we reach here, we've finished sending everything we might
     * have needed to send. Send EOF, if we need to.
     */
    if (s->outgoingeof == EOF_PENDING) {
        shutdown(s->s, SHUT_WR);
        s->outgoingeof = EOF_SENT;
    }

    /*
     * Also update the select status, because we don't need to select
     * for writing any more.
     */
    uxsel_tell(s);
}